

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraSublimeTextGenerator::AppendTarget
          (cmExtraSublimeTextGenerator *this,cmGeneratedFileStream *fout,string *targetName,
          cmLocalGenerator *lg,cmGeneratorTarget *target,char *make,cmMakefile *makefile,
          char *param_7,MapSourceFileFlags *sourceFileFlags,bool firstTarget)

{
  pointer pbVar1;
  cmSourceFile *this_00;
  pointer pcVar2;
  cmGeneratorTarget *target_00;
  bool bVar3;
  int iVar4;
  string *psVar5;
  RegularExpression *this_01;
  iterator iVar6;
  long *plVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  long *plVar10;
  size_type *psVar11;
  char *pcVar12;
  undefined8 uVar13;
  pointer ppcVar14;
  undefined8 uVar15;
  _Base_ptr this_02;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_bool>
  pVar16;
  string workString;
  string definesString;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string includesString;
  string makefileName;
  undefined1 local_238 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  long *local_1f8;
  ulong local_1f0;
  long local_1e8;
  undefined8 uStack_1e0;
  string local_1d8;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_1b8;
  string *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  string local_158;
  cmExtraSublimeTextGenerator *local_138;
  cmGeneratedFileStream *local_130;
  char *local_128;
  cmGeneratorTarget *local_120;
  _Base_ptr local_118;
  pointer local_110;
  pointer local_108;
  undefined1 local_100 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0 [2];
  char *local_b0;
  char *local_60;
  char *local_40;
  
  local_1a0 = targetName;
  local_128 = make;
  if (target != (cmGeneratorTarget *)0x0) {
    local_1b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_100._0_8_ = local_100 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"CMAKE_BUILD_TYPE","");
    psVar5 = cmMakefile::GetSafeDefinition(makefile,(string *)local_100);
    cmGeneratorTarget::GetSourceFiles(target,&local_1b8,psVar5);
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
    }
    local_110 = local_1b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (local_1b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_1b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_118 = &(sourceFileFlags->_M_t)._M_impl.super__Rb_tree_header._M_header;
      ppcVar14 = local_1b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      local_138 = this;
      local_130 = fout;
      local_120 = target;
LAB_00294d85:
      this_00 = *ppcVar14;
      local_108 = ppcVar14;
      this_01 = (RegularExpression *)cmSourceFile::GetFullPath(this_00,(string *)0x0);
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::find(&sourceFileFlags->_M_t,(key_type *)this_01);
      if (iVar6._M_node == local_118) {
        psVar5 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
        local_238._0_8_ = (pointer)0x0;
        local_238._8_8_ = (pointer)0x0;
        local_238._16_8_ = (pointer)0x0;
        local_100._0_8_ = local_100 + 0x10;
        pcVar2 = (psVar5->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_100,pcVar2,pcVar2 + psVar5->_M_string_length);
        local_e0[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_238._0_8_;
        local_e0[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_238._8_8_;
        local_e0[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_238._16_8_;
        local_238._0_8_ = (pointer)0x0;
        local_238._8_8_ = (pointer)0x0;
        local_238._16_8_ = (pointer)0x0;
        this_01 = (RegularExpression *)local_100;
        pVar16 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                 ::
                 _M_insert_unique<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                             *)sourceFileFlags,
                            (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_100);
        iVar6._M_node = (_Base_ptr)pVar16.first._M_node;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_e0);
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          this_01 = (RegularExpression *)(CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
          operator_delete((void *)local_100._0_8_,(ulong)this_01);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_238);
      }
      target_00 = local_120;
      ComputeFlagsForObject_abi_cxx11_
                ((string *)local_238,(cmExtraSublimeTextGenerator *)this_01,this_00,lg,local_120);
      ComputeDefines_abi_cxx11_
                (&local_1d8,(cmExtraSublimeTextGenerator *)this_01,this_00,lg,target_00);
      ComputeIncludes_abi_cxx11_
                (&local_158,(cmExtraSublimeTextGenerator *)this_01,this_00,lg,target_00);
      this_02 = iVar6._M_node + 2;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)this_02,*(pointer *)this_02);
      local_100._0_8_ = (pointer)0x0;
      local_b0 = (char *)0x0;
      local_60 = (char *)0x0;
      local_40 = (char *)0x0;
      cmsys::RegularExpression::compile
                ((RegularExpression *)local_100,
                 "(^|[ ])-[DIOUWfgs][^= ]+(=\\\"[^\"]+\\\"|=[^\"][^ ]+)?");
      local_198[0] = &local_188;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_198,local_238._0_8_,
                 (char *)(local_238._0_8_ + (long)(_Alloc_hider *)local_238._8_8_));
      std::__cxx11::string::append((char *)local_198);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_198,(ulong)local_1d8._M_dataplus._M_p);
      local_178 = &local_168;
      plVar10 = plVar7 + 2;
      if ((long *)*plVar7 == plVar10) {
        local_168 = *plVar10;
        lStack_160 = plVar7[3];
      }
      else {
        local_168 = *plVar10;
        local_178 = (long *)*plVar7;
      }
      local_170 = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_178);
      local_218._M_allocated_capacity = (size_type)&local_208;
      psVar11 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_208._M_allocated_capacity = *psVar11;
        local_208._8_8_ = plVar7[3];
      }
      else {
        local_208._M_allocated_capacity = *psVar11;
        local_218._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar7;
      }
      local_218._8_8_ = plVar7[1];
      *plVar7 = (long)psVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append
                         (local_218._M_local_buf,(ulong)local_158._M_dataplus._M_p);
      local_1f8 = &local_1e8;
      plVar7 = puVar8 + 2;
      if ((long *)*puVar8 == plVar7) {
        local_1e8 = *plVar7;
        uStack_1e0 = puVar8[3];
      }
      else {
        local_1e8 = *plVar7;
        local_1f8 = (long *)*puVar8;
      }
      local_1f0 = puVar8[1];
      *puVar8 = plVar7;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_allocated_capacity != &local_208) {
        operator_delete((void *)local_218._M_allocated_capacity,local_208._M_allocated_capacity + 1)
        ;
      }
      if (local_178 != &local_168) {
        operator_delete(local_178,local_168 + 1);
      }
      uVar13 = local_188._M_allocated_capacity;
      uVar15 = local_198[0];
      if (local_198[0] == &local_188) goto LAB_002950c3;
      do {
        operator_delete((void *)uVar15,uVar13 + 1);
LAB_002950c3:
        do {
          while( true ) {
            bVar3 = cmsys::RegularExpression::find
                              ((RegularExpression *)local_100,(char *)local_1f8,
                               (RegularExpressionMatch *)local_100);
            if (!bVar3) {
              if (local_1f8 != &local_1e8) {
                operator_delete(local_1f8,local_1e8 + 1);
              }
              if (local_40 != (char *)0x0) {
                operator_delete__(local_40);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p,
                                local_158.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                operator_delete(local_1d8._M_dataplus._M_p,
                                local_1d8.field_2._M_allocated_capacity + 1);
              }
              if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
                operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
              }
              ppcVar14 = local_108 + 1;
              this = local_138;
              fout = local_130;
              if (ppcVar14 == local_110) goto LAB_00295259;
              goto LAB_00294d85;
            }
            std::__cxx11::string::substr((ulong)&local_218,(ulong)&local_1f8);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_218);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_allocated_capacity != &local_208) {
              operator_delete((void *)local_218._M_allocated_capacity,
                              local_208._M_allocated_capacity + 1);
            }
            if ((ulong)((long)local_b0 - (long)local_60) < local_1f0) break;
            local_1f0 = 0;
            *(undefined1 *)local_1f8 = 0;
          }
          std::__cxx11::string::substr((ulong)&local_218,(ulong)&local_1f8);
          std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_218._M_local_buf);
          uVar13 = local_208._M_allocated_capacity;
          uVar15 = local_218._M_allocated_capacity;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_218._M_allocated_capacity == &local_208);
      } while( true );
    }
LAB_00295259:
    if (local_1b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1b8.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b8.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_100._8_8_ = (char *)0x0;
  local_100[0x10] = '\0';
  local_100._0_8_ = local_100 + 0x10;
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (local_238);
  iVar4 = std::__cxx11::string::compare(local_238);
  pbVar1 = (pointer)(local_238 + 0x10);
  if ((pointer)local_238._0_8_ != pbVar1) {
    operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
  }
  pcVar12 = "Makefile";
  if (iVar4 == 0) {
    pcVar12 = "build.ninja";
  }
  std::__cxx11::string::_M_replace((ulong)local_100,0,(char *)local_100._8_8_,(ulong)pcVar12);
  if (!firstTarget) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,",\n\t",3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t{\n\t\t\t\"name\": \"",0xf);
  cmLocalGenerator::GetProjectName_abi_cxx11_((string *)local_238,lg);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,(char *)local_238._0_8_,local_238._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," - ",3);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(local_1a0->_M_dataplus)._M_p,local_1a0->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\",\n",3);
  if ((pointer)local_238._0_8_ != pbVar1) {
    operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\t\"cmd\": [",0xb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,local_128,(allocator<char> *)&local_158);
  BuildMakeCommand((string *)local_238,this,&local_1d8,(char *)local_100._0_8_,local_1a0);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,(char *)local_238._0_8_,local_238._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"],\n",3);
  if ((pointer)local_238._0_8_ != pbVar1) {
    operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,"\t\t\t\"working_dir\": \"${project_path}\",\n",0x25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,
             "\t\t\t\"file_regex\": \"^(..[^:]*)(?::|\\\\()([0-9]+)(?::|\\\\))(?:([0-9]+):)?\\\\s*(.*)\"\n"
             ,0x4e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t}",3);
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
  }
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::AppendTarget(
  cmGeneratedFileStream& fout, const std::string& targetName,
  cmLocalGenerator* lg, cmGeneratorTarget* target, const char* make,
  const cmMakefile* makefile, const char* /*compiler*/,
  MapSourceFileFlags& sourceFileFlags, bool firstTarget)
{

  if (target != nullptr) {
    std::vector<cmSourceFile*> sourceFiles;
    target->GetSourceFiles(sourceFiles,
                           makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    for (cmSourceFile* sourceFile : sourceFiles) {
      MapSourceFileFlags::iterator sourceFileFlagsIter =
        sourceFileFlags.find(sourceFile->GetFullPath());
      if (sourceFileFlagsIter == sourceFileFlags.end()) {
        sourceFileFlagsIter =
          sourceFileFlags
            .insert(MapSourceFileFlags::value_type(sourceFile->GetFullPath(),
                                                   std::vector<std::string>()))
            .first;
      }
      std::vector<std::string>& flags = sourceFileFlagsIter->second;
      std::string flagsString =
        this->ComputeFlagsForObject(sourceFile, lg, target);
      std::string definesString = this->ComputeDefines(sourceFile, lg, target);
      std::string includesString =
        this->ComputeIncludes(sourceFile, lg, target);
      flags.clear();
      cmsys::RegularExpression flagRegex;
      // Regular expression to extract compiler flags from a string
      // https://gist.github.com/3944250
      const char* regexString =
        "(^|[ ])-[DIOUWfgs][^= ]+(=\\\"[^\"]+\\\"|=[^\"][^ ]+)?";
      flagRegex.compile(regexString);
      std::string workString =
        flagsString + " " + definesString + " " + includesString;
      while (flagRegex.find(workString)) {
        std::string::size_type start = flagRegex.start();
        if (workString[start] == ' ') {
          start++;
        }
        flags.push_back(workString.substr(start, flagRegex.end() - start));
        if (flagRegex.end() < workString.size()) {
          workString = workString.substr(flagRegex.end());
        } else {
          workString.clear();
        }
      }
    }
  }

  // Ninja uses ninja.build files (look for a way to get the output file name
  // from cmMakefile or something)
  std::string makefileName;
  if (this->GlobalGenerator->GetName() == "Ninja") {
    makefileName = "build.ninja";
  } else {
    makefileName = "Makefile";
  }
  if (!firstTarget) {
    fout << ",\n\t";
  }
  fout << "\t{\n\t\t\t\"name\": \"" << lg->GetProjectName() << " - "
       << targetName << "\",\n";
  fout << "\t\t\t\"cmd\": ["
       << this->BuildMakeCommand(make, makefileName.c_str(), targetName)
       << "],\n";
  fout << "\t\t\t\"working_dir\": \"${project_path}\",\n";
  fout << "\t\t\t\"file_regex\": \""
          "^(..[^:]*)(?::|\\\\()([0-9]+)(?::|\\\\))(?:([0-9]+):)?\\\\s*(.*)"
          "\"\n";
  fout << "\t\t}";
}